

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

Int __thiscall
ipx::Model::PresolveIPMStartingPoint
          (Model *this,double *x_user,double *xl_user,double *xu_user,double *slack_user,
          double *y_user,double *zl_user,double *zu_user,Vector *x_solver,Vector *xl_solver,
          Vector *xu_solver,Vector *y_solver,Vector *zl_solver,Vector *zu_solver)

{
  double dVar1;
  char cVar2;
  undefined4 in_EAX;
  int iVar3;
  double *__dest;
  double *__dest_00;
  double *__dest_01;
  double *__dest_02;
  double *__dest_03;
  double *__dest_04;
  double *__dest_05;
  long lVar4;
  long lVar5;
  Int IVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  Vector y_temp;
  Vector slack_temp;
  Vector xu_temp;
  Vector xl_temp;
  Vector x_temp;
  Vector zu_temp;
  Vector zl_temp;
  
  auVar10._0_4_ = -(uint)(x_user == (double *)0x0);
  auVar10._4_4_ = -(uint)(xl_user == (double *)0x0);
  auVar10._8_4_ = -(uint)(xu_user == (double *)0x0);
  auVar10._12_4_ = -(uint)(slack_user == (double *)0x0);
  iVar3 = movmskps(in_EAX,auVar10);
  IVar6 = 0x66;
  if ((((iVar3 == 0) && (y_user != (double *)0x0)) && (zl_user != (double *)0x0)) &&
     ((zu_user != (double *)0x0 && (IVar6 = 0x385, this->dualized_ == false)))) {
    x_temp._M_size = (size_t)this->num_var_;
    uVar7 = x_temp._M_size << 3;
    __dest = (double *)operator_new(uVar7);
    x_temp._M_data = __dest;
    memcpy(__dest,x_user,uVar7);
    xl_temp._M_size = (size_t)this->num_var_;
    uVar7 = xl_temp._M_size << 3;
    __dest_00 = (double *)operator_new(uVar7);
    xl_temp._M_data = __dest_00;
    memcpy(__dest_00,xl_user,uVar7);
    xu_temp._M_size = (size_t)this->num_var_;
    uVar7 = xu_temp._M_size << 3;
    __dest_01 = (double *)operator_new(uVar7);
    xu_temp._M_data = __dest_01;
    memcpy(__dest_01,xu_user,uVar7);
    slack_temp._M_size = (size_t)this->num_constr_;
    uVar7 = slack_temp._M_size << 3;
    __dest_02 = (double *)operator_new(uVar7);
    slack_temp._M_data = __dest_02;
    memcpy(__dest_02,slack_user,uVar7);
    y_temp._M_size = (size_t)this->num_constr_;
    uVar7 = y_temp._M_size << 3;
    __dest_03 = (double *)operator_new(uVar7);
    y_temp._M_data = __dest_03;
    memcpy(__dest_03,y_user,uVar7);
    zl_temp._M_size = (size_t)this->num_var_;
    uVar7 = zl_temp._M_size << 3;
    __dest_04 = (double *)operator_new(uVar7);
    zl_temp._M_data = __dest_04;
    memcpy(__dest_04,zl_user,uVar7);
    zu_temp._M_size = (size_t)this->num_var_;
    uVar7 = zu_temp._M_size << 3;
    __dest_05 = (double *)operator_new(uVar7);
    zu_temp._M_data = __dest_05;
    memcpy(__dest_05,zu_user,uVar7);
    ScalePoint(this,&x_temp,&xl_temp,&xu_temp,&slack_temp,&y_temp,&zl_temp,&zu_temp);
    iVar3 = this->num_var_;
    lVar4 = (long)iVar3;
    if (0 < lVar4) {
      lVar5 = 0;
      IVar6 = 0x69;
      do {
        if (0x7fefffffffffffff < (ulong)ABS(__dest[lVar5])) goto LAB_003a9987;
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
      if (0 < iVar3) {
        lVar5 = 0;
        do {
          dVar1 = __dest_00[lVar5];
          if (((dVar1 < 0.0) ||
              ((dVar9 = (this->scaled_lbuser_)._M_data[lVar5], dVar1 < INFINITY &&
               (dVar9 <= -INFINITY)))) || ((INFINITY <= dVar1 && (-INFINITY < dVar9))))
          goto LAB_003a9987;
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
        if (0 < iVar3) {
          lVar5 = 0;
          do {
            dVar1 = __dest_01[lVar5];
            if (((dVar1 < 0.0) ||
                ((dVar9 = (this->scaled_ubuser_)._M_data[lVar5], dVar1 < INFINITY &&
                 (INFINITY <= dVar9)))) || ((INFINITY <= dVar1 && (dVar9 < INFINITY))))
            goto LAB_003a9987;
            lVar5 = lVar5 + 1;
          } while (lVar4 != lVar5);
        }
      }
    }
    lVar5 = (long)this->num_constr_;
    if (0 < lVar5) {
      lVar8 = 0;
      IVar6 = 0x69;
      do {
        dVar1 = __dest_02[lVar8];
        if (0x7fefffffffffffff < (ulong)ABS(dVar1)) goto LAB_003a9987;
        cVar2 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8];
        if (cVar2 == '<') {
          if (dVar1 < 0.0) goto LAB_003a9987;
        }
        else if (cVar2 == '>') {
          if (0.0 < dVar1) goto LAB_003a9987;
        }
        else if ((cVar2 == '=') && ((dVar1 != 0.0 || (NAN(dVar1))))) goto LAB_003a9987;
        lVar8 = lVar8 + 1;
      } while (lVar5 != lVar8);
      if (0 < this->num_constr_) {
        lVar8 = 0;
        do {
          dVar1 = __dest_03[lVar8];
          if (0x7fefffffffffffff < (ulong)ABS(dVar1)) goto LAB_003a9987;
          cVar2 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8];
          if (cVar2 == '>') {
            if (dVar1 < 0.0) goto LAB_003a9987;
          }
          else if ((cVar2 == '<') && (0.0 < dVar1)) goto LAB_003a9987;
          lVar8 = lVar8 + 1;
        } while (lVar5 != lVar8);
      }
    }
    if (0 < iVar3) {
      lVar5 = 0;
      do {
        dVar1 = __dest_04[lVar5];
        dVar9 = ABS(dVar1);
        IVar6 = 0x69;
        if (((0x7fefffffffffffff < (ulong)dVar9 ||
             (long)dVar9 - 1U < 0xfffffffffffff && (long)dVar1 < 0) ||
             (uint)((ulong)((long)dVar9 + -0x10000000000000) >> 0x35) < 0x3ff && (long)dVar1 < 0) ||
           (((dVar1 != 0.0 || (NAN(dVar1))) && ((this->scaled_lbuser_)._M_data[lVar5] <= -INFINITY))
           )) goto LAB_003a9987;
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
      if (0 < iVar3) {
        lVar5 = 0;
        do {
          dVar1 = __dest_05[lVar5];
          dVar9 = ABS(dVar1);
          if (((0x7fefffffffffffff < (ulong)dVar9 ||
               (long)dVar9 - 1U < 0xfffffffffffff && (long)dVar1 < 0) ||
               (uint)((ulong)((long)dVar9 + -0x10000000000000) >> 0x35) < 0x3ff && (long)dVar1 < 0)
             || (((dVar1 != 0.0 || (NAN(dVar1))) &&
                 (INFINITY <= (this->scaled_ubuser_)._M_data[lVar5])))) goto LAB_003a9987;
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
      }
    }
    DualizeIPMStartingPoint
              (this,&x_temp,&xl_temp,&xu_temp,&slack_temp,&y_temp,&zl_temp,&zu_temp,x_solver,
               xl_solver,xu_solver,y_solver,zl_solver,zu_solver);
    IVar6 = 0;
LAB_003a9987:
    operator_delete(__dest_05);
    operator_delete(__dest_04);
    operator_delete(__dest_03);
    operator_delete(__dest_02);
    operator_delete(__dest_01);
    operator_delete(__dest_00);
    operator_delete(__dest);
  }
  return IVar6;
}

Assistant:

Int Model::PresolveIPMStartingPoint(const double* x_user,
                                    const double* xl_user,
                                    const double* xu_user,
                                    const double* slack_user,
                                    const double* y_user,
                                    const double* zl_user,
                                    const double* zu_user,
                                    Vector& x_solver,
                                    Vector& xl_solver,
                                    Vector& xu_solver,
                                    Vector& y_solver,
                                    Vector& zl_solver,
                                    Vector& zu_solver) const {
    if (!x_user || !xl_user || !xu_user || !slack_user ||
        !y_user || !zl_user || !zu_user)
        return IPX_ERROR_argument_null;
    if (dualized_)
        return IPX_ERROR_not_implemented;

    // Copy user point into workspace and apply model scaling.
    Vector x_temp(x_user, num_var_);
    Vector xl_temp(xl_user, num_var_);
    Vector xu_temp(xu_user, num_var_);
    Vector slack_temp(slack_user, num_constr_);
    Vector y_temp(y_user, num_constr_);
    Vector zl_temp(zl_user, num_var_);
    Vector zu_temp(zu_user, num_var_);
    ScalePoint(x_temp, xl_temp, xu_temp, slack_temp,  y_temp, zl_temp, zu_temp);

    // Check that point is compatible with bounds.
    for (Int j = 0; j < num_var_; ++j) {
        if (!std::isfinite(x_temp[j]))
            return IPX_ERROR_invalid_vector;
    }
    for (Int j = 0; j < num_var_; ++j) {
        if (!(xl_temp[j] >= 0.0) ||
            (scaled_lbuser_[j] == -INFINITY && xl_temp[j] != INFINITY) ||
            (scaled_lbuser_[j] != -INFINITY && xl_temp[j] == INFINITY))
            return IPX_ERROR_invalid_vector;
    }
    for (Int j = 0; j < num_var_; ++j) {
        if (!(xu_temp[j] >= 0.0) ||
            (scaled_ubuser_[j] == INFINITY && xu_temp[j] != INFINITY) ||
            (scaled_ubuser_[j] != INFINITY && xu_temp[j] == INFINITY))
            return IPX_ERROR_invalid_vector;
    }
    for (Int i = 0; i < num_constr_; ++i) {
        if (!std::isfinite(slack_temp[i]) ||
            (constr_type_[i] == '=' && !(slack_temp[i] == 0.0)) ||
            (constr_type_[i] == '<' && !(slack_temp[i] >= 0.0)) ||
            (constr_type_[i] == '>' && !(slack_temp[i] <= 0.0)) )
            return IPX_ERROR_invalid_vector;
    }
    for (Int i = 0; i < num_constr_; ++i) {
        if (!std::isfinite(y_temp[i]) ||
            (constr_type_[i] == '<' && !(y_temp[i] <= 0.0)) ||
            (constr_type_[i] == '>' && !(y_temp[i] >= 0.0)) )
            return IPX_ERROR_invalid_vector;
    }
    for (Int j = 0; j < num_var_; ++j) {
        if (!(zl_temp[j] >= 0.0 && zl_temp[j] < INFINITY) ||
            (scaled_lbuser_[j] == -INFINITY && zl_temp[j] != 0.0))
            return IPX_ERROR_invalid_vector;
    }
    for (Int j = 0; j < num_var_; ++j) {
        if (!(zu_temp[j] >= 0.0 && zu_temp[j] < INFINITY) ||
            (scaled_ubuser_[j] == INFINITY && zu_temp[j] != 0.0))
            return IPX_ERROR_invalid_vector;
    }

    DualizeIPMStartingPoint(x_temp, xl_temp, xu_temp, slack_temp,
                            y_temp, zl_temp, zu_temp,
                            x_solver, xl_solver, xu_solver,
                            y_solver, zl_solver, zu_solver);
    return 0;
}